

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::connect2(socks5 *this,error_code *e)

{
  value_type vVar1;
  bool bVar2;
  byte bVar3;
  reference pvVar4;
  pointer pvVar5;
  byte *pbVar6;
  undefined1 local_f0 [64];
  mutable_buffer local_b0;
  target_fns *local_a0;
  size_t len;
  undefined1 local_88 [32];
  type local_68;
  object_type local_48;
  uint local_34;
  uint local_30;
  int atyp;
  int status;
  int version;
  char *p;
  time_type local_18;
  error_code *e_local;
  socks5 *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_18.__d.__r = (duration)(duration)e;
    e_local = (error_code *)this;
    bVar2 = boost::system::error_code::operator_cast_to_bool(e);
    if (bVar2) {
      bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
      if (bVar2) {
        p._7_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&p + 7),
                   (error_code *)local_18.__d.__r);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      _status = (target_fns *)::std::array<char,_270UL>::data(&this->m_tmp_buf);
      bVar3 = read_uint8<char*>((char **)&status);
      atyp = (int)bVar3;
      bVar3 = read_uint8<char*>((char **)&status);
      local_30 = (uint)bVar3;
      _status = (target_fns *)((long)&_status->target_type + 1);
      bVar3 = read_uint8<char*>((char **)&status);
      local_34 = (uint)bVar3;
      if ((atyp == 5) && (local_30 == 0)) {
        if (local_34 == 1) {
          vVar1 = *(value_type *)&_status->target_type;
          pvVar4 = ::std::array<char,_270UL>::operator[](&this->m_tmp_buf,0);
          *pvVar4 = vVar1;
          pvVar5 = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
          local_48 = (object_type)boost::asio::buffer(pvVar5 + 1,5);
          local_88._16_8_ = read_bindaddr;
          local_88._24_8_ = (wait_op *)0x0;
          self((socks5 *)local_88);
          ::std::
          bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                    (&local_68,(offset_in_socks5_to_subr *)(local_88 + 0x10),
                     (shared_ptr<libtorrent::aux::socks5> *)local_88,
                     (_Placeholder<1> *)&::std::placeholders::_1);
          boost::asio::
          async_read<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (&this->m_socks5_sock,(mutable_buffer *)&local_48.__align,&local_68,(type *)0x0)
          ;
          ::std::
          _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          ::~_Bind(&local_68);
          ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                    ((shared_ptr<libtorrent::aux::socks5> *)local_88);
        }
        else if (local_34 == 3) {
          bVar3 = read_uint8<char*>((char **)&status);
          local_a0 = (target_fns *)(ulong)bVar3;
          pbVar6 = (byte *)::std::array<char,_270UL>::operator[](&this->m_tmp_buf,0);
          *pbVar6 = bVar3;
          pvVar5 = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
          local_b0 = boost::asio::buffer(pvVar5 + 1,(size_t)((long)&local_a0->target_type + 2));
          local_f0._16_8_ = read_domainname;
          local_f0._24_4_ = 0;
          local_f0[0x1c] = '\0';
          local_f0._29_3_ = 0;
          self((socks5 *)local_f0);
          ::std::
          bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                    ((type *)(local_f0 + 0x20),(offset_in_socks5_to_subr *)(local_f0 + 0x10),
                     (shared_ptr<libtorrent::aux::socks5> *)local_f0,
                     (_Placeholder<1> *)&::std::placeholders::_1);
          boost::asio::
          async_read<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (&this->m_socks5_sock,&local_b0,
                     (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)(local_f0 + 0x20),(type *)0x0);
          ::std::
          _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                    *)(local_f0 + 0x20));
          ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                    ((shared_ptr<libtorrent::aux::socks5> *)local_f0);
        }
      }
    }
  }
  return;
}

Assistant:

void socks5::connect2(error_code const& e)
{
	COMPLETE_ASYNC("socks5::connect2");

	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	int const version = read_uint8(p); // VERSION
	int const status = read_uint8(p); // STATUS
	++p; // RESERVED
	int const atyp = read_uint8(p); // address type

	if (version != 5 || status != 0) return;

	if (atyp == 1)
	{
		ADD_OUTSTANDING_ASYNC("socks5::read_bindaddr");
		// save the first byte of the IP address in the buffer. The
		// read_bindaddr() callback will use it
		m_tmp_buf[0] = *p;
		boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data() + 1, 5)
			, std::bind(&socks5::read_bindaddr, self(), _1));
	}
	else if (atyp == 3)
	{
		// we need to skip DOMAINNAME to imitate Python socks client
		std::size_t const len = read_uint8(p);
		ADD_OUTSTANDING_ASYNC("socks5::read_domainname");
		// save the string length in the buffer. The read_domainname() callback
		// will use it
		m_tmp_buf[0] = char(len);
		boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data()+1, len + 2)
			, std::bind(&socks5::read_domainname, self(), _1));
	}
	else
	{
		// in this case we need to read more data from the socket
		// no IPv6 support for UDP socks5
		TORRENT_ASSERT_FAIL();
		return;
	}
}